

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O0

void bcf_format_gt(bcf_fmt_t *fmt,int isample,kstring_t *str)

{
  uint8_t *puVar1;
  int iVar2;
  bool bVar3;
  int local_4c;
  int i_2;
  int32_t *ptr_2;
  int i_1;
  int16_t *ptr_1;
  int i;
  int8_t *ptr;
  kstring_t *str_local;
  int isample_local;
  bcf_fmt_t *fmt_local;
  
  iVar2 = fmt->type;
  if (iVar2 == 1) {
    puVar1 = fmt->p;
    iVar2 = isample * fmt->size;
    ptr_1._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (ptr_1._4_4_ < fmt->n) {
        bVar3 = puVar1[(long)ptr_1._4_4_ + (long)iVar2] != 0x81;
      }
      if (!bVar3) break;
      if (ptr_1._4_4_ != 0) {
        kputc((int)"/|"[(int)((int)(char)puVar1[(long)ptr_1._4_4_ + (long)iVar2] & 1)],str);
      }
      if ((char)puVar1[(long)ptr_1._4_4_ + (long)iVar2] >> 1 == '\0') {
        kputc(0x2e,str);
      }
      else {
        kputw(((int)(char)puVar1[(long)ptr_1._4_4_ + (long)iVar2] >> 1) + -1,str);
      }
      ptr_1._4_4_ = ptr_1._4_4_ + 1;
    }
    if (ptr_1._4_4_ == 0) {
      kputc(0x2e,str);
    }
  }
  else if (iVar2 == 2) {
    puVar1 = fmt->p;
    iVar2 = isample * fmt->size;
    ptr_2._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (ptr_2._4_4_ < fmt->n) {
        bVar3 = *(short *)(puVar1 + (long)ptr_2._4_4_ * 2 + (long)iVar2) != -0x7fff;
      }
      if (!bVar3) break;
      if (ptr_2._4_4_ != 0) {
        kputc((int)"/|"[(int)((int)*(short *)(puVar1 + (long)ptr_2._4_4_ * 2 + (long)iVar2) & 1)],
              str);
      }
      if (*(short *)(puVar1 + (long)ptr_2._4_4_ * 2 + (long)iVar2) >> 1 == 0) {
        kputc(0x2e,str);
      }
      else {
        kputw(((int)*(short *)(puVar1 + (long)ptr_2._4_4_ * 2 + (long)iVar2) >> 1) + -1,str);
      }
      ptr_2._4_4_ = ptr_2._4_4_ + 1;
    }
    if (ptr_2._4_4_ == 0) {
      kputc(0x2e,str);
    }
  }
  else {
    if (iVar2 != 3) {
      fprintf(_stderr,"FIXME: type %d in bcf_format_gt?\n",(ulong)(uint)fmt->type);
      abort();
    }
    puVar1 = fmt->p;
    iVar2 = isample * fmt->size;
    local_4c = 0;
    while( true ) {
      bVar3 = false;
      if (local_4c < fmt->n) {
        bVar3 = *(int *)(puVar1 + (long)local_4c * 4 + (long)iVar2) != -0x7fffffff;
      }
      if (!bVar3) break;
      if (local_4c != 0) {
        kputc((int)"/|"[(int)(*(uint *)(puVar1 + (long)local_4c * 4 + (long)iVar2) & 1)],str);
      }
      if (*(int *)(puVar1 + (long)local_4c * 4 + (long)iVar2) >> 1 == 0) {
        kputc(0x2e,str);
      }
      else {
        kputw((*(int *)(puVar1 + (long)local_4c * 4 + (long)iVar2) >> 1) + -1,str);
      }
      local_4c = local_4c + 1;
    }
    if (local_4c == 0) {
      kputc(0x2e,str);
    }
  }
  return;
}

Assistant:

static inline void bcf_format_gt(bcf_fmt_t *fmt, int isample, kstring_t *str)
{
    #define BRANCH(type_t, missing, vector_end) { \
        type_t *ptr = (type_t*) (fmt->p + isample*fmt->size); \
        int i; \
        for (i=0; i<fmt->n && ptr[i]!=vector_end; i++) \
        { \
            if ( i ) kputc("/|"[ptr[i]&1], str); \
            if ( !(ptr[i]>>1) ) kputc('.', str); \
            else kputw((ptr[i]>>1) - 1, str); \
        } \
        if (i == 0) kputc('.', str); \
    }
    switch (fmt->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  bcf_int8_missing, bcf_int8_vector_end); break;
        case BCF_BT_INT16: BRANCH(int16_t, bcf_int16_missing, bcf_int16_vector_end); break;
        case BCF_BT_INT32: BRANCH(int32_t, bcf_int32_missing, bcf_int32_vector_end); break;
        default: fprintf(stderr,"FIXME: type %d in bcf_format_gt?\n", fmt->type); abort(); break;
    }
    #undef BRANCH
}